

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyRandomness(SyPRNGCtx *pCtx,void *pBuf,sxu32 nLen)

{
  sxu8 sVar1;
  sxu8 *psVar2;
  uchar *zEnd;
  uchar *zBuf;
  sxu32 nLen_local;
  void *pBuf_local;
  SyPRNGCtx *pCtx_local;
  
  psVar2 = (sxu8 *)((long)pBuf + (ulong)nLen);
  zEnd = (uchar *)pBuf;
  if (pCtx->nMagic == 0x13c4) {
    for (; zEnd < psVar2; zEnd = zEnd + 4) {
      sVar1 = randomByte(pCtx);
      *zEnd = sVar1;
      if (psVar2 <= zEnd + 1) break;
      sVar1 = randomByte(pCtx);
      zEnd[1] = sVar1;
      if (psVar2 <= zEnd + 2) break;
      sVar1 = randomByte(pCtx);
      zEnd[2] = sVar1;
      if (psVar2 <= zEnd + 3) break;
      sVar1 = randomByte(pCtx);
      zEnd[3] = sVar1;
    }
    pCtx_local._4_4_ = 0;
  }
  else {
    pCtx_local._4_4_ = -0x18;
  }
  return pCtx_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyRandomness(SyPRNGCtx *pCtx, void *pBuf, sxu32 nLen)
{
	unsigned char *zBuf = (unsigned char *)pBuf;
	unsigned char *zEnd = &zBuf[nLen];
#if defined(UNTRUST)
	if( pCtx == 0 || pBuf == 0 || nLen <= 0 ){
		return SXERR_EMPTY;
	}
#endif
	if(pCtx->nMagic != SXPRNG_MAGIC ){
		return SXERR_CORRUPT;
	}
	for(;;){
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
		if( zBuf >= zEnd ){break;}	zBuf[0] = randomByte(pCtx);	zBuf++;	
	}
	return SXRET_OK;  
}